

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fStencilTexturingTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::UploadTex2DArrayCase::iterate(UploadTex2DArrayCase *this)

{
  IVec3 *this_00;
  IVec3 *this_01;
  RenderContext *context;
  TestLog *pTVar1;
  code *pcVar2;
  TextureFormat this_02;
  uint uVar3;
  undefined8 uVar4;
  _Alloc_hider _Var5;
  ChannelOrder CVar6;
  bool bVar7;
  int iVar8;
  GLenum err;
  deUint32 dVar9;
  undefined4 uVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ObjectTraits *pOVar11;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  long *plVar12;
  void *__dest;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  undefined4 extraout_var_03;
  TestError *this_03;
  undefined8 uVar14;
  size_type *psVar15;
  long *plVar16;
  undefined1 *__n;
  ulong uVar17;
  void *__buf;
  char *pcVar18;
  long lVar19;
  int levelNdx;
  int z;
  UploadTex2DArrayCase *pUVar20;
  ChannelOrder CVar21;
  int y;
  undefined1 local_418 [8];
  undefined1 local_410 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_400;
  int local_3f0;
  deUint8 indices [6];
  undefined2 uStack_3e2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3d8;
  float positions [8];
  float texCoord [12];
  string local_360;
  uint local_33c;
  VertexArrayBinding *local_338;
  UploadTex2DArrayCase *local_330;
  ScopedLogSection section;
  size_type local_320;
  VertexArrayBinding vertexArrays [2];
  undefined1 local_268 [32];
  Texture depthStencilTex;
  Renderbuffer colorBuf;
  Framebuffer fbo;
  PixelBufferAccess levelAccess;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d0 [4];
  ios_base local_190 [8];
  ios_base local_188 [32];
  deUint32 local_168;
  bool local_140;
  TextureLevel readLevel;
  TextureLevel uploadLevel;
  Functions *gl;
  
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  iVar8 = (*context->_vptr_RenderContext[3])(context);
  gl = (Functions *)CONCAT44(extraout_var,iVar8);
  iVar8 = (*context->_vptr_RenderContext[3])(context);
  pOVar11 = glu::objectTraits(OBJECTTYPE_FRAMEBUFFER);
  glu::ObjectWrapper::ObjectWrapper
            (&fbo.super_ObjectWrapper,(Functions *)CONCAT44(extraout_var_00,iVar8),pOVar11);
  iVar8 = (*context->_vptr_RenderContext[3])(context);
  pOVar11 = glu::objectTraits(OBJECTTYPE_RENDERBUFFER);
  glu::ObjectWrapper::ObjectWrapper
            (&colorBuf.super_ObjectWrapper,(Functions *)CONCAT44(extraout_var_01,iVar8),pOVar11);
  iVar8 = (*context->_vptr_RenderContext[3])();
  pOVar11 = glu::objectTraits(OBJECTTYPE_TEXTURE);
  glu::ObjectWrapper::ObjectWrapper
            (&depthStencilTex.super_ObjectWrapper,(Functions *)CONCAT44(extraout_var_02,iVar8),
             pOVar11);
  levelAccess.super_ConstPixelBufferAccess.m_format = glu::mapGLInternalFormat(this->m_format);
  tcu::TextureLevel::TextureLevel(&uploadLevel,(TextureFormat *)&levelAccess,0x29,0xd,7);
  checkDepthStencilFormatSupport((this->super_TestCase).m_context,this->m_format);
  iVar8 = 0;
  local_330 = this;
  do {
    tcu::TextureLevel::getAccess((PixelBufferAccess *)vertexArrays,&uploadLevel);
    tcu::getSubregion(&levelAccess,(PixelBufferAccess *)vertexArrays,0,0,iVar8,0x29,0xd,1);
    if (iVar8 == 3) {
      renderTestPatternReference(&levelAccess);
    }
    else {
      tcu::clearStencil(&levelAccess,iVar8);
    }
    iVar8 = iVar8 + 1;
  } while (iVar8 != 7);
  (*gl->bindTexture)(0x8c1a,depthStencilTex.super_ObjectWrapper.m_object);
  pUVar20 = local_330;
  (*gl->texStorage3D)(0x8c1a,1,local_330->m_format,0x29,0xd,7);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            (&levelAccess.super_ConstPixelBufferAccess,&uploadLevel);
  glu::texSubImage3D(context,0x8c1a,0,0,0,0,&levelAccess.super_ConstPixelBufferAccess);
  err = (*gl->getError)();
  glu::checkError(err,"Uploading texture data failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fStencilTexturingTests.cpp"
                  ,0x25e);
  (*gl->bindRenderbuffer)(0x8d41,colorBuf.super_ObjectWrapper.m_object);
  (*gl->renderbufferStorage)(0x8d41,0x8236,0x29,0xd);
  (*gl->bindFramebuffer)(0x8d40,fbo.super_ObjectWrapper.m_object);
  (*gl->framebufferRenderbuffer)(0x8d40,0x8ce0,0x8d41,colorBuf.super_ObjectWrapper.m_object);
  checkFramebufferStatus(gl);
  levelAccess.super_ConstPixelBufferAccess.m_format.order = RGBA;
  levelAccess.super_ConstPixelBufferAccess.m_format.type = UNSIGNED_INT32;
  uVar14 = 0;
  tcu::TextureLevel::TextureLevel(&readLevel,(TextureFormat *)&levelAccess,0x29,0xd,1);
  this_00 = &levelAccess.super_ConstPixelBufferAccess.m_size;
  uVar17 = CONCAT71((int7)((ulong)uVar14 >> 8),1);
  local_338 = vertexArrays;
  CVar21 = R;
  do {
    local_33c = (uint)uVar17;
    pTVar1 = ((pUVar20->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&levelAccess);
    std::ostream::operator<<((ostringstream *)&levelAccess,CVar21);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&levelAccess);
    std::ios_base::~ios_base(local_190);
    plVar12 = (long *)std::__cxx11::string::replace((ulong)local_418,0,(char *)0x0,0x1cf1c6a);
    vertexArrays[0].binding._0_8_ = &vertexArrays[0].binding.name._M_string_length;
    psVar15 = (size_type *)(plVar12 + 2);
    if ((size_type *)*plVar12 == psVar15) {
      vertexArrays[0].binding.name._M_string_length = *psVar15;
      vertexArrays[0].binding.name.field_2._0_8_ = plVar12[3];
    }
    else {
      vertexArrays[0].binding.name._M_string_length = *psVar15;
      vertexArrays[0].binding._0_8_ = (size_type *)*plVar12;
    }
    vertexArrays[0].binding.name._M_dataplus._M_p = (pointer)plVar12[1];
    *plVar12 = (long)psVar15;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&levelAccess);
    std::ostream::operator<<((ostringstream *)&levelAccess,CVar21);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&levelAccess);
    std::ios_base::~ios_base(local_190);
    plVar12 = (long *)std::__cxx11::string::replace((ulong)positions,0,(char *)0x0,0x1c3d738);
    texCoord._0_8_ = texCoord + 4;
    plVar16 = plVar12 + 2;
    if ((long *)*plVar12 == plVar16) {
      texCoord._24_8_ = plVar12[3];
      texCoord[4] = (float)*plVar16;
      texCoord[5] = (float)((ulong)*plVar16 >> 0x20);
    }
    else {
      texCoord[4] = (float)*plVar16;
      texCoord[5] = (float)((ulong)*plVar16 >> 0x20);
      texCoord._0_8_ = (long *)*plVar12;
    }
    texCoord[2] = (float)plVar12[1];
    texCoord[3] = (float)((ulong)plVar12[1] >> 0x20);
    *plVar12 = (long)plVar16;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    tcu::ScopedLogSection::ScopedLogSection
              (&section,pTVar1,(string *)vertexArrays,(string *)texCoord);
    if ((float *)texCoord._0_8_ != texCoord + 4) {
      operator_delete((void *)texCoord._0_8_,CONCAT44(texCoord[5],texCoord[4]) + 1);
    }
    if ((float *)positions._0_8_ != positions + 4) {
      operator_delete((void *)positions._0_8_,positions._16_8_ + 1);
    }
    if ((size_type *)vertexArrays[0].binding._0_8_ != &vertexArrays[0].binding.name._M_string_length
       ) {
      operator_delete((void *)vertexArrays[0].binding._0_8_,
                      vertexArrays[0].binding.name._M_string_length + 1);
    }
    if (local_418 != (undefined1  [8])((long)local_410 + 8)) {
      operator_delete((void *)local_418,CONCAT26(local_410._14_2_,local_410._8_6_) + 1);
    }
    dVar9 = depthStencilTex.super_ObjectWrapper.m_object;
    local_268[0x10] = 0;
    local_268._17_8_ = 0;
    local_268._0_8_ = (pointer)0x0;
    local_268[8] = 0;
    local_268._9_7_ = 0;
    memset(vertexArrays,0,0xac);
    positions._0_8_ = positions + 4;
    texCoord[0] = 2.36819e-43;
    texCoord[1] = 0.0;
    __dest = (void *)std::__cxx11::string::_M_create((ulong *)positions,(ulong)texCoord);
    uVar14 = texCoord._0_8_;
    positions[4] = texCoord[0];
    positions[5] = texCoord[1];
    positions._0_8_ = __dest;
    memcpy(__dest,
           "#version 300 es\nin highp vec4 a_position;\nin highp vec3 a_texCoord;\nout highp vec3 v_texCoord;\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tv_texCoord = a_texCoord;\n}\n"
           ,0xa9);
    uVar4 = texCoord._0_8_;
    texCoord[0] = (float)uVar14;
    texCoord[1] = SUB84(uVar14,4);
    positions[2] = texCoord[0];
    positions[3] = texCoord[1];
    *(undefined1 *)((long)__dest + uVar14) = 0;
    local_418 = (undefined1  [8])((ulong)local_418 & 0xffffffff00000000);
    local_410._0_8_ = &local_400;
    texCoord._0_8_ = uVar4;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_410,positions._0_8_,uVar14 + positions._0_8_);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(&vertexArrays[0].binding.type + ((ulong)local_418 & 0xffffffff) * 6),
                (value_type *)local_410);
    _indices = (pointer)&local_3d8;
    local_360._M_dataplus._M_p = (pointer)0xc6;
    paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)std::__cxx11::string::_M_create((ulong *)indices,(ulong)&local_360);
    _Var5._M_p = local_360._M_dataplus._M_p;
    local_3d8._M_allocated_capacity = (size_type)local_360._M_dataplus._M_p;
    _indices = (pointer)paVar13;
    memcpy(paVar13,
           "#version 300 es\nuniform highp usampler2DArray u_sampler;\nin highp vec3 v_texCoord;\nlayout(location = 0) out highp uint o_stencil;\nvoid main (void)\n{\n\to_stencil = texture(u_sampler, v_texCoord).x;\n}\n"
           ,0xc6);
    paVar13->_M_local_buf[(long)_Var5._M_p] = '\0';
    texCoord[0] = 1.4013e-45;
    texCoord._8_8_ = texCoord + 6;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(texCoord + 2),_indices,_Var5._M_p + _indices);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(&vertexArrays[0].binding.type + (texCoord._0_8_ & 0xffffffff) * 6),
                (value_type *)(texCoord + 2));
    glu::ShaderProgram::ShaderProgram
              ((ShaderProgram *)&levelAccess,context,(ProgramSources *)vertexArrays);
    if ((float *)texCoord._8_8_ != texCoord + 6) {
      operator_delete((void *)texCoord._8_8_,texCoord._24_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_indices != &local_3d8) {
      operator_delete(_indices,local_3d8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_410._0_8_ != &local_400) {
      operator_delete((void *)local_410._0_8_,
                      CONCAT17(local_400._M_local_buf[7],
                               CONCAT16(local_400._M_local_buf[6],
                                        local_400._M_allocated_capacity._0_6_)) + 1);
    }
    if ((float *)positions._0_8_ != positions + 4) {
      operator_delete((void *)positions._0_8_,positions._16_8_ + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_268);
    std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
              ((vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> *)
               &vertexArrays[1].pointer.stride);
    lVar19 = 0x78;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&vertexArrays[0].binding.type + lVar19));
      lVar19 = lVar19 + -0x18;
    } while (lVar19 != -0x18);
    positions[4] = -1.0;
    positions[5] = 1.0;
    positions._24_8_ = &DAT_3f8000003f800000;
    texCoord[2] = (float)(int)CVar21;
    positions[0] = -1.0;
    positions[1] = -1.0;
    positions[2] = 1.0;
    positions[3] = -1.0;
    texCoord[0] = 0.0;
    texCoord[1] = 0.0;
    texCoord[3] = 1.0;
    texCoord[4] = 0.0;
    texCoord[6] = 0.0;
    texCoord[7] = 1.0;
    texCoord._36_8_ = &DAT_3f8000003f800000;
    _indices = (pointer)&local_3d8;
    local_3d8._M_allocated_capacity = 0x697469736f705f61;
    local_3d8._8_2_ = 0x6e6f;
    local_3d8._M_local_buf[10] = '\0';
    local_418._0_4_ = A;
    local_410._0_8_ = &local_400;
    texCoord[5] = texCoord[2];
    texCoord[8] = texCoord[2];
    texCoord[0xb] = texCoord[2];
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_410,_indices,local_3d8._M_local_buf + 10);
    local_3f0 = 0;
    vertexArrays[0].binding.type = local_418._0_4_;
    vertexArrays[0].binding.name._M_dataplus._M_p = (pointer)&vertexArrays[0].binding.name.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&vertexArrays[0].binding.name,local_410._0_8_,
               (char *)(local_410._0_8_ + CONCAT26(local_410._14_2_,local_410._8_6_)));
    vertexArrays[0].binding.location = local_3f0;
    vertexArrays[0].pointer.componentType = VTX_COMP_FLOAT;
    vertexArrays[0].pointer.convert = VTX_COMP_CONVERT_NONE;
    vertexArrays[0].pointer.numComponents = 2;
    vertexArrays[0].pointer.numElements = 4;
    vertexArrays[0].pointer.stride = 0;
    vertexArrays[0].pointer.data = positions;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_410._0_8_ != &local_400) {
      operator_delete((void *)local_410._0_8_,
                      CONCAT17(local_400._M_local_buf[7],
                               CONCAT16(local_400._M_local_buf[6],
                                        local_400._M_allocated_capacity._0_6_)) + 1);
    }
    local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
    local_360.field_2._M_allocated_capacity = 0x6f6f437865745f61;
    local_360.field_2._8_2_ = 0x6472;
    local_360._M_string_length = 10;
    local_360.field_2._M_local_buf[10] = '\0';
    local_418._0_4_ = A;
    local_410._0_8_ = &local_400;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_410,local_360._M_dataplus._M_p,
               (undefined1 *)((long)&local_360.field_2 + 10));
    local_3f0 = 0;
    vertexArrays[1].binding.type = local_418._0_4_;
    vertexArrays[1].binding.name._M_dataplus._M_p = (pointer)&vertexArrays[1].binding.name.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&vertexArrays[1].binding.name,local_410._0_8_,
               (char *)(local_410._0_8_ + CONCAT26(local_410._14_2_,local_410._8_6_)));
    vertexArrays[1].binding.location = local_3f0;
    vertexArrays[1].pointer.componentType = VTX_COMP_FLOAT;
    vertexArrays[1].pointer.convert = VTX_COMP_CONVERT_NONE;
    vertexArrays[1].pointer.numComponents = 3;
    vertexArrays[1].pointer.numElements = 4;
    vertexArrays[1].pointer.stride = 0;
    vertexArrays[1].pointer.data = texCoord;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_410._0_8_ != &local_400) {
      operator_delete((void *)local_410._0_8_,
                      CONCAT17(local_400._M_local_buf[7],
                               CONCAT16(local_400._M_local_buf[6],
                                        local_400._M_allocated_capacity._0_6_)) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_360._M_dataplus._M_p != &local_360.field_2) {
      operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_indices != &local_3d8) {
      operator_delete(_indices,local_3d8._M_allocated_capacity + 1);
    }
    indices[0] = '\0';
    indices[1] = '\0';
    indices[2] = '\0';
    indices[3] = '\0';
    indices[4] = '\x01';
    indices[5] = '\x03';
    indices[0] = '\0';
    indices[1] = '\x01';
    indices[2] = '\x02';
    indices[3] = '\x02';
    iVar8 = (*context->_vptr_RenderContext[3])();
    lVar19 = CONCAT44(extraout_var_03,iVar8);
    if (local_140 == false) {
      this_03 = (TestError *)__cxa_allocate_exception(0x38);
      local_418 = (undefined1  [8])((long)local_410 + 8);
      local_410._8_6_ = 0x6c69706d6f43;
      local_410._14_2_ = 0x2065;
      local_400._M_allocated_capacity._0_6_ = 0x64656c696166;
      local_410._0_8_ = (pointer)0xe;
      local_400._M_local_buf[6] = '\0';
      tcu::TestError::TestError(this_03,(string *)local_418);
      __cxa_throw(this_03,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    (**(code **)(lVar19 + 8))(0x84c0);
    (**(code **)(lVar19 + 0xb8))(0x8c1a,dVar9);
    (**(code **)(lVar19 + 0x1360))(0x8c1a,0x2801,0x2600);
    (**(code **)(lVar19 + 0x1360))(0x8c1a,0x2800,0x2600);
    (**(code **)(lVar19 + 0x1360))(0x8c1a,0x90ea,0x1901);
    dVar9 = (**(code **)(lVar19 + 0x800))();
    glu::checkError(dVar9,"Texture state setup failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fStencilTexturingTests.cpp"
                    ,0x13e);
    (**(code **)(lVar19 + 0x1680))(local_168);
    pcVar2 = *(code **)(lVar19 + 0x14f0);
    uVar10 = (**(code **)(lVar19 + 0xb48))(local_168,"u_sampler");
    (*pcVar2)(uVar10,0);
    dVar9 = (**(code **)(lVar19 + 0x800))();
    glu::checkError(dVar9,"Program setup failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fStencilTexturingTests.cpp"
                    ,0x142);
    (**(code **)(lVar19 + 0x1a00))(0,0,0x29,0xd);
    local_418._0_4_ = R;
    local_418._4_4_ = UNORM_INT32;
    local_410._0_8_ = local_410._0_8_ & 0xffffffff00000000;
    local_410._8_6_ = SUB86(indices,0);
    local_410._14_2_ = (undefined2)((ulong)indices >> 0x30);
    glu::draw(context,local_168,2,vertexArrays,(PrimitiveList *)local_418,(DrawUtilCallback *)0x0);
    lVar19 = -0xa0;
    paVar13 = &vertexArrays[1].binding.name.field_2;
    do {
      plVar12 = (long *)(((string *)(paVar13 + -1))->_M_dataplus)._M_p;
      if (paVar13 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)plVar12) {
        operator_delete(plVar12,paVar13->_M_allocated_capacity + 1);
      }
      paVar13 = paVar13 + -5;
      lVar19 = lVar19 + 0x50;
    } while (lVar19 != 0);
    glu::ShaderProgram::~ShaderProgram((ShaderProgram *)&levelAccess);
    tcu::PixelBufferAccess::PixelBufferAccess(&levelAccess,&readLevel);
    glu::readPixels(context,0,0,&levelAccess);
    if (CVar21 == L) {
      vertexArrays[0].binding.type = 0x13;
      vertexArrays[0].binding._4_4_ = 0x1e;
      tcu::TextureLevel::TextureLevel
                ((TextureLevel *)&levelAccess,(TextureFormat *)vertexArrays,0x29,0xd,1);
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)vertexArrays,(TextureLevel *)&levelAccess);
      renderTestPatternReference((PixelBufferAccess *)vertexArrays);
      pTVar1 = ((pUVar20->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                ((ConstPixelBufferAccess *)vertexArrays,(TextureLevel *)&levelAccess);
      tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                ((ConstPixelBufferAccess *)local_418,&readLevel);
      bVar7 = compareStencilToRed(pTVar1,(ConstPixelBufferAccess *)vertexArrays,
                                  (ConstPixelBufferAccess *)local_418);
      tcu::TextureLevel::~TextureLevel((TextureLevel *)&levelAccess);
    }
    else {
      this_02 = (TextureFormat)
                ((pUVar20->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                ((ConstPixelBufferAccess *)local_418,&readLevel);
      if ((int)local_410._4_4_ < 1) {
        iVar8 = 0;
      }
      else {
        z = 0;
        iVar8 = 0;
        do {
          if (0 < (int)local_410._0_4_) {
            y = 0;
            do {
              tcu::ConstPixelBufferAccess::getPixelInt
                        (&levelAccess.super_ConstPixelBufferAccess,(int)local_418,y,z);
              CVar6 = levelAccess.super_ConstPixelBufferAccess.m_format.order;
              if (levelAccess.super_ConstPixelBufferAccess.m_format.order != CVar21) {
                if (iVar8 < 10) {
                  levelAccess.super_ConstPixelBufferAccess.m_format = this_02;
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)this_00,"ERROR: Expected ",0x10);
                  std::ostream::operator<<(this_00,CVar21);
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", got ",6);
                  std::ostream::operator<<(this_00,CVar6);
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," at (",5);
                  std::ostream::operator<<(this_00,y);
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
                  std::ostream::operator<<(this_00,z);
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,")",1);
                  tcu::MessageBuilder::operator<<
                            ((MessageBuilder *)&levelAccess,
                             (EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_014e5af7:
                  std::__cxx11::ostringstream::~ostringstream
                            ((ostringstream *)&levelAccess.super_ConstPixelBufferAccess.m_size);
                  std::ios_base::~ios_base(local_188);
                }
                else if (iVar8 == 10) {
                  levelAccess.super_ConstPixelBufferAccess.m_format = this_02;
                  std::__cxx11::ostringstream::ostringstream
                            ((ostringstream *)&levelAccess.super_ConstPixelBufferAccess.m_size);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&levelAccess.super_ConstPixelBufferAccess.m_size,"...",3);
                  tcu::MessageBuilder::operator<<
                            ((MessageBuilder *)&levelAccess,
                             (EndMessageToken *)&tcu::TestLog::EndMessage);
                  goto LAB_014e5af7;
                }
                iVar8 = iVar8 + 1;
              }
              y = y + 1;
            } while (y < (int)local_410._0_4_);
          }
          z = z + 1;
        } while (z < (int)local_410._4_4_);
      }
      levelAccess.super_ConstPixelBufferAccess.m_format = this_02;
      std::__cxx11::ostringstream::ostringstream
                ((ostringstream *)&levelAccess.super_ConstPixelBufferAccess.m_size);
      pUVar20 = local_330;
      this_01 = &levelAccess.super_ConstPixelBufferAccess.m_size;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,"Found ",6);
      std::ostream::operator<<(this_01,iVar8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_01," faulty pixels, comparison ",0x1b);
      bVar7 = iVar8 == 0;
      pcVar18 = "FAILED!";
      if (bVar7) {
        pcVar18 = "passed.";
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,pcVar18,7);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&levelAccess,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_01);
      std::ios_base::~ios_base(local_188);
      texCoord._0_8_ = texCoord + 4;
      levelAccess.super_ConstPixelBufferAccess.m_format.order = sBGR;
      levelAccess.super_ConstPixelBufferAccess.m_format.type = SNORM_INT8;
      texCoord._0_8_ = std::__cxx11::string::_M_create((ulong *)texCoord,(ulong)&levelAccess);
      texCoord[4] = (float)levelAccess.super_ConstPixelBufferAccess.m_format.order;
      texCoord[5] = (float)levelAccess.super_ConstPixelBufferAccess.m_format.type;
      builtin_strncpy((char *)texCoord._0_8_,"ComparisonResult",0x10);
      *(char *)(texCoord._0_8_ + (long)levelAccess.super_ConstPixelBufferAccess.m_format) = '\0';
      positions._0_8_ = positions + 4;
      levelAccess.super_ConstPixelBufferAccess.m_format.order = DS|L;
      levelAccess.super_ConstPixelBufferAccess.m_format.type = SNORM_INT8;
      texCoord[2] = texCoord[4];
      texCoord[3] = texCoord[5];
      positions._0_8_ = std::__cxx11::string::_M_create((ulong *)positions,(ulong)&levelAccess);
      positions[4] = (float)levelAccess.super_ConstPixelBufferAccess.m_format.order;
      positions[5] = (float)levelAccess.super_ConstPixelBufferAccess.m_format.type;
      builtin_strncpy((char *)positions._0_8_,"Image comparison result",0x17);
      positions[2] = (float)levelAccess.super_ConstPixelBufferAccess.m_format.order;
      positions[3] = (float)levelAccess.super_ConstPixelBufferAccess.m_format.type;
      *(char *)(positions._0_8_ + (long)levelAccess.super_ConstPixelBufferAccess.m_format) = '\0';
      tcu::LogImageSet::LogImageSet
                ((LogImageSet *)vertexArrays,(string *)texCoord,(string *)positions);
      tcu::TestLog::startImageSet
                ((TestLog *)this_02,(char *)vertexArrays[0].binding._0_8_,
                 (char *)vertexArrays[0].binding.name.field_2._8_8_);
      _indices = (pointer)&local_3d8;
      local_3d8._M_allocated_capacity._0_7_ = 0x746c75736552;
      local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
      local_320 = 0x15;
      local_360._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_360,(ulong)&local_320);
      local_360.field_2._M_allocated_capacity = local_320;
      *(undefined8 *)local_360._M_dataplus._M_p = 0x7320746c75736552;
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_360._M_dataplus._M_p + 8) = 't';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_360._M_dataplus._M_p + 9) = 'e';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_360._M_dataplus._M_p + 10) = 'n';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_360._M_dataplus._M_p + 0xb) = 'c';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_360._M_dataplus._M_p + 0xc) = 'i';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_360._M_dataplus._M_p + 0xd) = 'l';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_360._M_dataplus._M_p + 0xe) = ' ';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_360._M_dataplus._M_p + 0xf) = 'b';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_360._M_dataplus._M_p + 0xd) = 'l';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_360._M_dataplus._M_p + 0xe) = ' ';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_360._M_dataplus._M_p + 0xf) = 'b';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_360._M_dataplus._M_p + 0x10) = 'u';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_360._M_dataplus._M_p + 0x11) = 'f';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_360._M_dataplus._M_p + 0x12) = 'f';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_360._M_dataplus._M_p + 0x13) = 'e';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_360._M_dataplus._M_p + 0x14) = 'r';
      local_360._M_string_length = local_320;
      local_360._M_dataplus._M_p[local_320] = '\0';
      __n = local_418;
      tcu::LogImage::LogImage
                ((LogImage *)&levelAccess,(string *)indices,&local_360,
                 (ConstPixelBufferAccess *)local_418,QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write((LogImage *)&levelAccess,this_02.order,__buf,(size_t)__n);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)levelAccess.super_ConstPixelBufferAccess.m_data != local_1d0) {
        operator_delete(levelAccess.super_ConstPixelBufferAccess.m_data,
                        local_1d0[0]._M_allocated_capacity + 1);
      }
      if (levelAccess.super_ConstPixelBufferAccess.m_format !=
          (TextureFormat)(levelAccess.super_ConstPixelBufferAccess.m_size.m_data + 2)) {
        operator_delete((void *)levelAccess.super_ConstPixelBufferAccess.m_format,
                        levelAccess.super_ConstPixelBufferAccess._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_360._M_dataplus._M_p != &local_360.field_2) {
        operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_indices != &local_3d8) {
        operator_delete(_indices,local_3d8._M_allocated_capacity + 1);
      }
      if ((VertexArrayPointer *)vertexArrays[0].binding.name.field_2._8_8_ !=
          &vertexArrays[0].pointer) {
        operator_delete((void *)vertexArrays[0].binding.name.field_2._8_8_,
                        CONCAT44(vertexArrays[0].pointer.convert,
                                 vertexArrays[0].pointer.componentType) + 1);
      }
      if ((size_type *)vertexArrays[0].binding._0_8_ !=
          &vertexArrays[0].binding.name._M_string_length) {
        operator_delete((void *)vertexArrays[0].binding._0_8_,
                        vertexArrays[0].binding.name._M_string_length + 1);
      }
      if ((float *)positions._0_8_ != positions + 4) {
        operator_delete((void *)positions._0_8_,positions._16_8_ + 1);
      }
      if ((float *)texCoord._0_8_ != texCoord + 4) {
        operator_delete((void *)texCoord._0_8_,CONCAT44(texCoord[5],texCoord[4]) + 1);
      }
      tcu::TestLog::endImageSet((TestLog *)this_02);
    }
    tcu::TestLog::endSection(section.m_log);
    uVar3 = local_33c & 0xff;
    if (bVar7 == false) {
      uVar3 = 0;
    }
    uVar17 = (ulong)uVar3;
    CVar21 = CVar21 + A;
    if ((bVar7 & CVar21 != RGB) == 0) {
      pcVar18 = "Image comparison failed";
      if ((uVar3 & 1) != 0) {
        pcVar18 = "Pass";
      }
      tcu::TestContext::setTestResult
                ((pUVar20->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                 (byte)~(byte)uVar3 & QP_TEST_RESULT_FAIL,pcVar18);
      tcu::TextureLevel::~TextureLevel(&readLevel);
      tcu::TextureLevel::~TextureLevel(&uploadLevel);
      glu::ObjectWrapper::~ObjectWrapper(&depthStencilTex.super_ObjectWrapper);
      glu::ObjectWrapper::~ObjectWrapper(&colorBuf.super_ObjectWrapper);
      glu::ObjectWrapper::~ObjectWrapper(&fbo.super_ObjectWrapper);
      return STOP;
    }
  } while( true );
}

Assistant:

IterateResult iterate (void)
	{
		const glu::RenderContext&	renderCtx			= m_context.getRenderContext();
		const glw::Functions&		gl					= renderCtx.getFunctions();
		const int					width				= 41;
		const int					height				= 13;
		const int					levels				= 7;
		const int					ptrnLevel			= 3;
		glu::Framebuffer			fbo					(renderCtx);
		glu::Renderbuffer			colorBuf			(renderCtx);
		glu::Texture				depthStencilTex		(renderCtx);
		TextureLevel				uploadLevel			(glu::mapGLInternalFormat(m_format), width, height, levels);

		checkDepthStencilFormatSupport(m_context, m_format);

		for (int levelNdx = 0; levelNdx < levels; levelNdx++)
		{
			const tcu::PixelBufferAccess levelAccess = tcu::getSubregion(uploadLevel.getAccess(), 0, 0, levelNdx, width, height, 1);

			if (levelNdx == ptrnLevel)
				renderTestPatternReference(levelAccess);
			else
				tcu::clearStencil(levelAccess, levelNdx);
		}

		gl.bindTexture(GL_TEXTURE_2D_ARRAY, *depthStencilTex);
		gl.texStorage3D(GL_TEXTURE_2D_ARRAY, 1, m_format, width, height, levels);
		glu::texSubImage3D(renderCtx, GL_TEXTURE_2D_ARRAY, 0, 0, 0, 0, uploadLevel);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Uploading texture data failed");

		gl.bindRenderbuffer(GL_RENDERBUFFER, *colorBuf);
		gl.renderbufferStorage(GL_RENDERBUFFER, GL_R32UI, width, height);

		gl.bindFramebuffer(GL_FRAMEBUFFER, *fbo);
		gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, *colorBuf);
		checkFramebufferStatus(gl);

		{
			TextureLevel	readLevel		(TextureFormat(TextureFormat::RGBA, TextureFormat::UNSIGNED_INT32), width, height);
			bool			allLevelsOk		= true;

			for (int levelNdx = 0; levelNdx < levels; levelNdx++)
			{
				tcu::ScopedLogSection section(m_testCtx.getLog(), "Level" + de::toString(levelNdx), "Level " + de::toString(levelNdx));
				bool levelOk;

				blitStencilToColor2DArray(renderCtx, *depthStencilTex, width, height, levelNdx);
				glu::readPixels(renderCtx, 0, 0, readLevel);

				if (levelNdx == ptrnLevel)
				{
					TextureLevel reference(TextureFormat(TextureFormat::S, TextureFormat::UNSIGNED_INT8), width, height);
					renderTestPatternReference(reference);

					levelOk = compareStencilToRed(m_testCtx.getLog(), reference, readLevel);
				}
				else
					levelOk = compareRedChannel(m_testCtx.getLog(), readLevel, levelNdx);

				if (!levelOk)
				{
					allLevelsOk = false;
					break;
				}
			}

			m_testCtx.setTestResult(allLevelsOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
									allLevelsOk ? "Pass"				: "Image comparison failed");
		}

		return STOP;
	}